

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::WriteSpecialTargetsBottom
          (cmLocalUnixMakefileGenerator3 *this,ostream *makefileStream)

{
  cmGlobalGenerator *this_00;
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  string *relDir;
  string_view sVar4;
  allocator<char> local_231;
  string local_230;
  undefined1 local_210 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_depends;
  string local_1e8;
  cmAlphaNum local_1c8;
  cmAlphaNum local_198;
  undefined1 local_168 [8];
  string runRule;
  string local_140 [8];
  string cmakefileName;
  string local_110;
  cmAlphaNum local_f0;
  cmAlphaNum local_c0;
  undefined1 local_90 [8];
  string rescanRule;
  cmake *cm;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  allocator<char> local_39;
  string local_38;
  ostream *local_18;
  ostream *makefileStream_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  local_18 = makefileStream;
  makefileStream_local = (ostream *)this;
  WriteDivider(this,makefileStream);
  poVar2 = std::operator<<(local_18,"# Special targets to cleanup operation of make.\n");
  std::operator<<(poVar2,"\n");
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_SUPPRESS_REGENERATION",&local_39);
  bVar1 = cmGlobalGenerator::GlobalSettingIsOn(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&cm);
    rescanRule.field_2._8_8_ =
         cmGlobalGenerator::GetCMakeInstance
                   ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator);
    bVar1 = cmake::DoWriteGlobVerifyTarget((cmake *)rescanRule.field_2._8_8_);
    if (bVar1) {
      cmAlphaNum::cmAlphaNum(&local_c0,"$(CMAKE_COMMAND) -P ");
      psVar3 = cmake::GetGlobVerifyScript_abi_cxx11_((cmake *)rescanRule.field_2._8_8_);
      sVar4 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
      cmakefileName.field_2._8_8_ = sVar4._M_len;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_110,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,sVar4,SHELL);
      cmAlphaNum::cmAlphaNum(&local_f0,&local_110);
      cmStrCat<>((string *)local_90,&local_c0,&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&cm,(value_type *)local_90);
      std::__cxx11::string::~string((string *)local_90);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_140,"CMakeFiles/Makefile.cmake",
               (allocator<char> *)(runRule.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(runRule.field_2._M_local_buf + 0xf));
    cmAlphaNum::cmAlphaNum
              (&local_198,
               "$(CMAKE_COMMAND) -S$(CMAKE_SOURCE_DIR) -B$(CMAKE_BINARY_DIR) --check-build-system ")
    ;
    sVar4 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_140);
    no_depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)sVar4._M_len;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_1e8,
               &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
               sVar4,SHELL);
    cmAlphaNum::cmAlphaNum(&local_1c8,&local_1e8);
    cmStrCat<char[3]>((string *)local_168,&local_198,&local_1c8,(char (*) [3])0xc72699);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_210);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cm,(value_type *)local_168);
    bVar1 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
    if (!bVar1) {
      psVar3 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
      relDir = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
      CreateCDCommand(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&cm,psVar3,relDir);
    }
    poVar2 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"cmake_check_build_system",&local_231);
    WriteMakeRule(this,poVar2,
                  "Special rule to run CMake to check the build system integrity.\nNo rule that depends on this can have commands that come from listfiles\nbecause they might be regenerated."
                  ,&local_230,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_210,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&cm,true,false);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator(&local_231);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_210);
    std::__cxx11::string::~string((string *)local_168);
    std::__cxx11::string::~string(local_140);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&cm);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteSpecialTargetsBottom(
  std::ostream& makefileStream)
{
  this->WriteDivider(makefileStream);
  makefileStream << "# Special targets to cleanup operation of make.\n"
                 << "\n";

  // Write special "cmake_check_build_system" target to run cmake with
  // the --check-build-system flag.
  if (!this->GlobalGenerator->GlobalSettingIsOn(
        "CMAKE_SUPPRESS_REGENERATION")) {
    // Build command to run CMake to check if anything needs regenerating.
    std::vector<std::string> commands;
    cmake* cm = this->GlobalGenerator->GetCMakeInstance();
    if (cm->DoWriteGlobVerifyTarget()) {
      std::string rescanRule =
        cmStrCat("$(CMAKE_COMMAND) -P ",
                 this->ConvertToOutputFormat(cm->GetGlobVerifyScript(),
                                             cmOutputConverter::SHELL));
      commands.push_back(rescanRule);
    }
    std::string cmakefileName = "CMakeFiles/Makefile.cmake";
    std::string runRule = cmStrCat(
      "$(CMAKE_COMMAND) -S$(CMAKE_SOURCE_DIR) -B$(CMAKE_BINARY_DIR) "
      "--check-build-system ",
      this->ConvertToOutputFormat(cmakefileName, cmOutputConverter::SHELL),
      " 0");

    std::vector<std::string> no_depends;
    commands.push_back(std::move(runRule));
    if (!this->IsRootMakefile()) {
      this->CreateCDCommand(commands, this->GetBinaryDirectory(),
                            this->GetCurrentBinaryDirectory());
    }
    this->WriteMakeRule(makefileStream,
                        "Special rule to run CMake to check the build system "
                        "integrity.\n"
                        "No rule that depends on this can have "
                        "commands that come from listfiles\n"
                        "because they might be regenerated.",
                        "cmake_check_build_system", no_depends, commands,
                        true);
  }
}